

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_CreateP2wshMultisigAddress_Test::
~ElementsAddressFactory_CreateP2wshMultisigAddress_Test
          (ElementsAddressFactory_CreateP2wshMultisigAddress_Test *this)

{
  void *in_RDI;
  
  ~ElementsAddressFactory_CreateP2wshMultisigAddress_Test
            ((ElementsAddressFactory_CreateP2wshMultisigAddress_Test *)0x200928);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CreateP2wshMultisigAddress)
{
   std::vector<Pubkey> pubkeys;
   pubkeys.push_back(Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af"));
   pubkeys.push_back(Pubkey("038d87a23b18cee3a3615eb03035e74cafa8388b48c9263bf2b3a4081d51ffcee7"));
   pubkeys.push_back(Pubkey("027bb433e43e5e3526e435bd579289dfd4b9c4acdb2e3e80bd04dcd996edc15c73"));

   ElementsAddressFactory factory(NetType::kLiquidV1);
   EXPECT_NO_THROW(Address addr = factory.CreateP2wshMultisigAddress(2, pubkeys));

   std::vector<Pubkey> empty_pubkeys;
   EXPECT_THROW(factory.CreateP2wshMultisigAddress(2, empty_pubkeys), CfdException);
   EXPECT_THROW(factory.CreateP2wshMultisigAddress(0, pubkeys), CfdException);
   EXPECT_THROW(factory.CreateP2wshMultisigAddress(5, pubkeys), CfdException);
}